

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_object.cpp
# Opt level: O2

void * __thiscall booster::shared_object::resolve_symbol(shared_object *this,string *name)

{
  void *pvVar1;
  runtime_error *this_00;
  allocator local_39;
  string local_38;
  
  pvVar1 = ((this->d).ptr_)->handle;
  if (pvVar1 != (void *)0x0) {
    pvVar1 = (void *)dlsym(pvVar1,(name->_M_dataplus)._M_p);
    return pvVar1;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string
            ((string *)&local_38,
             "booster::shared_object::resolve_symbol: the shared_object is not open!",&local_39);
  runtime_error::runtime_error(this_00,&local_38);
  __cxa_throw(this_00,&runtime_error::typeinfo,runtime_error::~runtime_error);
}

Assistant:

void shared_object::close()
	{
		if(d->handle) {
			FreeLibrary(d->handle);
			d->handle = 0;
		}
	}